

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

void __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ComputeShaderBase(ComputeShaderBase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  vec4 *pvVar6;
  undefined1 auVar7 [16];
  RenderTarget *pRVar5;
  
  deqp::SubcaseBase::SubcaseBase(&this->super_SubcaseBase);
  (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_020d1ff8;
  iVar4 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  pRVar5 = (RenderTarget *)CONCAT44(extraout_var,iVar4);
  this->renderTarget = pRVar5;
  this->pixelFormat = &pRVar5->m_pixelFormat;
  (this->g_color_eps).m_data[0] = 0.0;
  (this->g_color_eps).m_data[1] = 0.0;
  (this->g_color_eps).m_data[2] = 0.0;
  (this->g_color_eps).m_data[3] = 0.0;
  pvVar6 = &this->g_color_eps;
  iVar4 = (pRVar5->m_pixelFormat).redBits;
  if ((iVar4 != 0) && (iVar1 = (pRVar5->m_pixelFormat).greenBits, iVar1 != 0)) {
    iVar2 = (pRVar5->m_pixelFormat).blueBits;
    if ((iVar2 != 0) && (iVar3 = (pRVar5->m_pixelFormat).alphaBits, iVar3 != 0)) {
      auVar7._0_4_ = (float)(int)(float)(iVar4 * 0x800000 + 0x3f800000) + -1.0;
      auVar7._4_4_ = (float)(int)(float)(iVar1 * 0x800000 + 0x3f800000) + -1.0;
      auVar7._8_4_ = (float)(int)(float)(iVar2 * 0x800000 + 0x3f800000) + -1.0;
      auVar7._12_4_ = (float)(int)(float)(iVar3 * 0x800000 + 0x3f800000) + -1.0;
      auVar7 = divps(_DAT_01a1c5b0,auVar7);
      pvVar6->m_data[0] = auVar7._0_4_ + 0.00012207031;
      (this->g_color_eps).m_data[1] = auVar7._4_4_ + 0.00012207031;
      (this->g_color_eps).m_data[2] = auVar7._8_4_ + 0.00012207031;
      (this->g_color_eps).m_data[3] = auVar7._12_4_ + 0.00012207031;
      return;
    }
    iVar2 = (pRVar5->m_pixelFormat).blueBits;
    if (iVar2 != 0) {
      pvVar6->m_data[0] = 1.0 / ((float)(1 << ((byte)iVar4 & 0x1f)) + -1.0) + 0.00012207031;
      (this->g_color_eps).m_data[1] =
           1.0 / ((float)(1 << ((byte)iVar1 & 0x1f)) + -1.0) + 0.00012207031;
      (this->g_color_eps).m_data[2] =
           1.0 / ((float)(1 << ((byte)iVar2 & 0x1f)) + -1.0) + 0.00012207031;
      (this->g_color_eps).m_data[3] = 1.0001221;
      return;
    }
  }
  pvVar6->m_data[0] = 0.00012207031;
  pvVar6->m_data[1] = 0.00012207031;
  (this->g_color_eps).m_data[2] = 0.00012207031;
  (this->g_color_eps).m_data[3] = 0.00012207031;
  return;
}

Assistant:

ComputeShaderBase()
		: renderTarget(m_context.getRenderContext().getRenderTarget()), pixelFormat(renderTarget.getPixelFormat())
	{
		float epsilon_zero = 1.f / (1 << 13);
		if (pixelFormat.redBits != 0 && pixelFormat.greenBits != 0 && pixelFormat.blueBits != 0 &&
			pixelFormat.alphaBits != 0)
		{
			g_color_eps = vec4(1.f / ((float)(1 << pixelFormat.redBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.greenBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.blueBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.alphaBits) - 1.0f)) +
						  vec4(epsilon_zero);
		}
		else if (pixelFormat.redBits != 0 && pixelFormat.greenBits != 0 && pixelFormat.blueBits != 0)
		{
			g_color_eps = vec4(1.f / ((float)(1 << pixelFormat.redBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.greenBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.blueBits) - 1.0f), 1.f) +
						  vec4(epsilon_zero);
		}
		else
		{
			g_color_eps = vec4(epsilon_zero);
		}
	}